

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

string * __thiscall
cmRST::ReplaceSubstitutions(string *__return_storage_ptr__,cmRST *this,string *line)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  pointer ppVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string local_110 [32];
  string local_f0 [32];
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  string local_c0;
  _Base_ptr local_a0;
  undefined1 local_98;
  const_iterator local_90;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  replaced;
  _Self local_78;
  iterator replace;
  string substitute;
  size_type end;
  size_type start;
  long local_30;
  size_type pos;
  string *line_local;
  cmRST *this_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_30 = 0;
  while( true ) {
    lVar2 = std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find(&this->Substitution,(char *)(lVar2 + local_30));
    if (!bVar1) break;
    cmsys::RegularExpression::start(&this->Substitution,2);
    sVar3 = cmsys::RegularExpression::end(&this->Substitution,2);
    cmsys::RegularExpression::match_abi_cxx11_((string *)&replace,&this->Substitution,3);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->Replace,(key_type *)&replace);
    replaced._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->Replace);
    bVar1 = std::operator!=(&local_78,(_Self *)&replaced.second);
    if (bVar1) {
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(&this->Replaced,(value_type *)&replace);
      local_a0 = (_Base_ptr)pVar5.first._M_node;
      local_98 = pVar5.second;
      local_90._M_node = local_a0;
      replaced.first._M_node._0_1_ = local_98;
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_78);
        ReplaceSubstitutions(&local_c0,this,&ppVar4->second);
        std::__cxx11::string::operator=((string *)&replace,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        local_c8 = local_90._M_node;
        local_d0 = (_Base_ptr)
                   std::
                   set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::erase_abi_cxx11_((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                       *)&this->Replaced,local_90);
      }
    }
    std::__cxx11::string::substr((ulong)local_f0,(ulong)line);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&replace);
    local_30 = sVar3 + local_30;
    std::__cxx11::string::~string((string *)&replace);
  }
  std::__cxx11::string::substr((ulong)local_110,(ulong)line);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_110);
  std::__cxx11::string::~string(local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRST::ReplaceSubstitutions(std::string const& line)
{
  std::string out;
  std::string::size_type pos = 0;
  while (this->Substitution.find(line.c_str() + pos)) {
    std::string::size_type start = this->Substitution.start(2);
    std::string::size_type end = this->Substitution.end(2);
    std::string substitute = this->Substitution.match(3);
    std::map<std::string, std::string>::iterator replace =
      this->Replace.find(substitute);
    if (replace != this->Replace.end()) {
      std::pair<std::set<std::string>::iterator, bool> replaced =
        this->Replaced.insert(substitute);
      if (replaced.second) {
        substitute = this->ReplaceSubstitutions(replace->second);
        this->Replaced.erase(replaced.first);
      }
    }
    out += line.substr(pos, start);
    out += substitute;
    pos += end;
  }
  out += line.substr(pos);
  return out;
}